

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::InsertLocalMinimaIntoAEL(Clipper *this,cInt botY)

{
  _func_int *p_Var1;
  long *plVar2;
  TEdge *edge;
  TEdge *edge_00;
  Join *pJVar3;
  long lVar4;
  long lVar5;
  TEdge *e;
  int iVar6;
  bool bVar7;
  OutPt *op1;
  TEdge *pTVar8;
  pointer ppJVar9;
  OutPt *pOVar10;
  pointer ppJVar11;
  size_type i;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  IntPoint OffPt;
  
  do {
    do {
      while( true ) {
        p_Var1 = this->_vptr_Clipper[-3];
        plVar2 = *(long **)(p_Var1 + (long)&(this->m_Joins).
                                            super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                           );
        if ((plVar2 == *(long **)(p_Var1 + 0x10 +
                                 (long)&(this->m_Joins).
                                        super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                 )) || (*plVar2 != botY)) {
          return;
        }
        *(long **)(p_Var1 + (long)&(this->m_Joins).
                                   super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                  ) = plVar2 + 3;
        edge = (TEdge *)plVar2[1];
        edge_00 = (TEdge *)plVar2[2];
        if (edge == (TEdge *)0x0) break;
        InsertEdgeIntoAEL(this,edge,(TEdge *)0x0);
        if (edge_00 != (TEdge *)0x0) {
          InsertEdgeIntoAEL(this,edge_00,edge);
          SetWindingCount(this,edge);
          iVar6 = edge->WindCnt2;
          edge_00->WindCnt = edge->WindCnt;
          edge_00->WindCnt2 = iVar6;
          bVar7 = IsContributing(this,edge);
          if (bVar7) {
            op1 = AddLocalMinPoly(this,edge,edge_00,(IntPoint *)edge);
          }
          else {
            op1 = (OutPt *)0x0;
          }
          ClipperBase::InsertScanbeam
                    ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                     (edge->Top).Y);
          goto LAB_001151f9;
        }
        SetWindingCount(this,edge);
        bVar7 = IsContributing(this,edge);
        if (bVar7) {
          AddOutPt(this,edge,(IntPoint *)edge);
        }
        ClipperBase::InsertScanbeam
                  ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                   (edge->Top).Y);
      }
      InsertEdgeIntoAEL(this,edge_00,(TEdge *)0x0);
      SetWindingCount(this,edge_00);
      bVar7 = IsContributing(this,edge_00);
      op1 = (OutPt *)0x0;
      if (bVar7) {
        op1 = AddOutPt(this,edge_00,(IntPoint *)edge_00);
      }
    } while (edge_00 == (TEdge *)0x0);
LAB_001151f9:
    pTVar8 = edge_00;
    if ((edge_00->Dx != -1e+40) || (NAN(edge_00->Dx))) {
LAB_0011523b:
      ClipperBase::InsertScanbeam
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                 (pTVar8->Top).Y);
    }
    else {
      pTVar8 = this->m_SortedEdges;
      edge_00->PrevInSEL = (TEdge *)0x0;
      if (pTVar8 != (TEdge *)0x0) {
        pTVar8->PrevInSEL = edge_00;
      }
      this->m_SortedEdges = edge_00;
      edge_00->NextInSEL = pTVar8;
      pTVar8 = edge_00->NextInLML;
      if (pTVar8 != (TEdge *)0x0) goto LAB_0011523b;
    }
    if (edge != (TEdge *)0x0) {
      if (((op1 != (OutPt *)0x0) && (edge_00->Dx == -1e+40)) && (!NAN(edge_00->Dx))) {
        ppJVar9 = (this->m_GhostJoins).
                  super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppJVar11 = (this->m_GhostJoins).
                   super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        if ((ppJVar11 != ppJVar9) && (edge_00->WindDelta != 0)) {
          for (uVar12 = 0; uVar12 < (ulong)((long)ppJVar11 - (long)ppJVar9 >> 3);
              uVar12 = uVar12 + 1) {
            pJVar3 = ppJVar9[uVar12];
            lVar4 = (pJVar3->OffPt).X;
            lVar14 = (pJVar3->OutPt1->Pt).X;
            lVar5 = (edge_00->Bot).X;
            lVar16 = (edge_00->Top).X;
            lVar13 = lVar4;
            if (lVar14 < lVar4) {
              lVar13 = lVar14;
            }
            if (lVar14 <= lVar4) {
              lVar14 = lVar4;
            }
            lVar15 = lVar16;
            if (lVar5 < lVar16) {
              lVar15 = lVar5;
            }
            if (lVar16 < lVar5) {
              lVar16 = lVar5;
            }
            if ((lVar13 < lVar16) && (lVar15 < lVar14)) {
              OffPt.Y = (pJVar3->OffPt).Y;
              OffPt.X = lVar4;
              AddJoin(this,pJVar3->OutPt1,op1,OffPt);
              ppJVar9 = (this->m_GhostJoins).
                        super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              ppJVar11 = (this->m_GhostJoins).
                         super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            }
          }
        }
      }
      if (((((-1 < edge->OutIdx) && (pTVar8 = edge->PrevInAEL, pTVar8 != (TEdge *)0x0)) &&
           ((pTVar8->Curr).X == (edge->Bot).X)) &&
          ((-1 < pTVar8->OutIdx &&
           (bVar7 = SlopesEqual(pTVar8->Bot,pTVar8->Top,edge->Curr,edge->Top,
                                (bool)(this->_vptr_Clipper[-3] + 8)
                                      [(long)&(this->m_GhostJoins).
                                              super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                      ]), bVar7)))) &&
         ((edge->WindDelta != 0 && (pTVar8->WindDelta != 0)))) {
        pOVar10 = AddOutPt(this,pTVar8,(IntPoint *)edge);
        AddJoin(this,op1,pOVar10,edge->Top);
      }
      pTVar8 = edge->NextInAEL;
      if (pTVar8 != edge_00) {
        if (((-1 < edge_00->OutIdx) && (e = edge_00->PrevInAEL, -1 < e->OutIdx)) &&
           ((bVar7 = SlopesEqual(e->Curr,e->Top,edge_00->Curr,edge_00->Top,
                                 (bool)(this->_vptr_Clipper[-3] + 8)
                                       [(long)&(this->m_GhostJoins).
                                               super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                       ]), bVar7 &&
            ((edge_00->WindDelta != 0 && (e->WindDelta != 0)))))) {
          pOVar10 = AddOutPt(this,e,(IntPoint *)edge_00);
          AddJoin(this,op1,pOVar10,edge_00->Top);
          pTVar8 = edge->NextInAEL;
        }
        if (pTVar8 != (TEdge *)0x0) {
          for (; pTVar8 != edge_00; pTVar8 = pTVar8->NextInAEL) {
            IntersectEdges(this,edge_00,pTVar8,&edge->Curr);
          }
        }
      }
    }
  } while( true );
}

Assistant:

void Clipper::InsertLocalMinimaIntoAEL(const cInt botY)
{
  const LocalMinimum *lm;
  while (PopLocalMinima(botY, lm))
  {
    TEdge* lb = lm->LeftBound;
    TEdge* rb = lm->RightBound;
    
    OutPt *Op1 = 0;
    if (!lb)
    {
      //nb: don't insert LB into either AEL or SEL
      InsertEdgeIntoAEL(rb, 0);
      SetWindingCount(*rb);
      if (IsContributing(*rb))
        Op1 = AddOutPt(rb, rb->Bot); 
    } 
    else if (!rb)
    {
      InsertEdgeIntoAEL(lb, 0);
      SetWindingCount(*lb);
      if (IsContributing(*lb))
        Op1 = AddOutPt(lb, lb->Bot);
      InsertScanbeam(lb->Top.Y);
    }
    else
    {
      InsertEdgeIntoAEL(lb, 0);
      InsertEdgeIntoAEL(rb, lb);
      SetWindingCount( *lb );
      rb->WindCnt = lb->WindCnt;
      rb->WindCnt2 = lb->WindCnt2;
      if (IsContributing(*lb))
        Op1 = AddLocalMinPoly(lb, rb, lb->Bot);      
      InsertScanbeam(lb->Top.Y);
    }

     if (rb)
     {
		 if (IsHorizontal(*rb))
		 {
			 AddEdgeToSEL(rb);
			 if (rb->NextInLML) 
				 InsertScanbeam(rb->NextInLML->Top.Y);
		 }
		 else InsertScanbeam( rb->Top.Y );
     }

    if (!lb || !rb) continue;

    //if any output polygons share an edge, they'll need joining later ...
    if (Op1 && IsHorizontal(*rb) && 
      m_GhostJoins.size() > 0 && (rb->WindDelta != 0))
    {
      for (JoinList::size_type i = 0; i < m_GhostJoins.size(); ++i)
      {
        Join* jr = m_GhostJoins[i];
        //if the horizontal Rb and a 'ghost' horizontal overlap, then convert
        //the 'ghost' join to a real join ready for later ...
        if (HorzSegmentsOverlap(jr->OutPt1->Pt.X, jr->OffPt.X, rb->Bot.X, rb->Top.X))
          AddJoin(jr->OutPt1, Op1, jr->OffPt);
      }
    }

    if (lb->OutIdx >= 0 && lb->PrevInAEL && 
      lb->PrevInAEL->Curr.X == lb->Bot.X &&
      lb->PrevInAEL->OutIdx >= 0 &&
      SlopesEqual(lb->PrevInAEL->Bot, lb->PrevInAEL->Top, lb->Curr, lb->Top, m_UseFullRange) &&
      (lb->WindDelta != 0) && (lb->PrevInAEL->WindDelta != 0))
    {
        OutPt *Op2 = AddOutPt(lb->PrevInAEL, lb->Bot);
        AddJoin(Op1, Op2, lb->Top);
    }

    if(lb->NextInAEL != rb)
    {

      if (rb->OutIdx >= 0 && rb->PrevInAEL->OutIdx >= 0 &&
        SlopesEqual(rb->PrevInAEL->Curr, rb->PrevInAEL->Top, rb->Curr, rb->Top, m_UseFullRange) &&
        (rb->WindDelta != 0) && (rb->PrevInAEL->WindDelta != 0))
      {
          OutPt *Op2 = AddOutPt(rb->PrevInAEL, rb->Bot);
          AddJoin(Op1, Op2, rb->Top);
      }

      TEdge* e = lb->NextInAEL;
      if (e)
      {
        while( e != rb )
        {
          //nb: For calculating winding counts etc, IntersectEdges() assumes
          //that param1 will be to the Right of param2 ABOVE the intersection ...
          IntersectEdges(rb , e , lb->Curr); //order important here
          e = e->NextInAEL;
        }
      }
    }
    
  }
}